

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O2

ArgIface * __thiscall Args::Command::findChild(Command *this,String *name)

{
  ArgIface *pAVar1;
  
  do {
    pAVar1 = GroupIface::findArgument(&this->super_GroupIface,name);
    if (pAVar1 != (ArgIface *)0x0) {
      return pAVar1;
    }
    this = this->m_subCommand;
  } while (this != (Command *)0x0);
  return (ArgIface *)0x0;
}

Assistant:

ArgIface * findChild(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name )
	{
		auto * arg = GroupIface::findArgument( name );

		if( !arg && m_subCommand )
			return m_subCommand->findChild( name );

		return arg;
	}